

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_per_branch(CPUS390XState_conflict *env,uint64_t from,uint64_t to)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  
  uVar4 = (uint)env->cregs[9];
  if ((int)uVar4 < 0) {
    if ((uVar4 >> 0x17 & 1) != 0) {
      uVar1 = env->cregs[10];
      uVar2 = env->cregs[0xb];
      if (uVar2 < uVar1) {
        bVar3 = uVar1 <= to || to <= uVar2;
      }
      else {
        bVar3 = uVar1 <= to && to <= uVar2;
      }
      if (!bVar3) {
        return;
      }
    }
    env->per_address = from;
    uVar1 = (env->psw).mask;
    env->per_perc_atmid =
         ((ushort)(uint)(uVar1 >> 0x2c) & 0xc) +
         ((ushort)(uVar1 >> 0x36) & 0x10 |
         (ushort)(uVar1 >> 0x1a) & 0x20 | (ushort)(uVar1 >> 0x19) & 0x80) + 0x8040;
  }
  return;
}

Assistant:

void HELPER(per_branch)(CPUS390XState *env, uint64_t from, uint64_t to)
{
    if ((env->cregs[9] & PER_CR9_EVENT_BRANCH)) {
        if (!(env->cregs[9] & PER_CR9_CONTROL_BRANCH_ADDRESS)
            || get_per_in_range(env, to)) {
            env->per_address = from;
            env->per_perc_atmid = PER_CODE_EVENT_BRANCH | get_per_atmid(env);
        }
    }
}